

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFLogger.cc
# Opt level: O2

void __thiscall QPDFLogger::setInfo(QPDFLogger *this,shared_ptr<Pipeline> *p)

{
  element_type *peVar1;
  __shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2> *p_Var2;
  
  if ((p->super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>)._M_ptr == (element_type *)0x0) {
    peVar1 = (this->m).super___shared_ptr<QPDFLogger::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    p_Var2 = &(peVar1->p_stdout).super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>;
    if ((peVar1->p_save).super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (peVar1->p_stdout).super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_ptr) {
      p_Var2 = &(peVar1->p_stderr).super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>;
    }
    std::__shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&p->super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>,p_Var2);
  }
  std::__shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(((this->m).super___shared_ptr<QPDFLogger::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr
               )->p_info).super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>,
             &p->super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>);
  return;
}

Assistant:

void
QPDFLogger::setInfo(std::shared_ptr<Pipeline> p)
{
    if (p == nullptr) {
        if (m->p_save == m->p_stdout) {
            p = m->p_stderr;
        } else {
            p = m->p_stdout;
        }
    }
    m->p_info = p;
}